

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O1

_Bool COSE_Sign0_map_put_int(HCOSE_SIGN0 h,int key,cn_cbor *value,int flags,cose_errback *perr)

{
  _Bool _Var1;
  
  if ((h == (HCOSE_SIGN0)0x0) || (_Var1 = _COSE_IsInList(Sign0Root,(COSE *)h), !_Var1)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    return false;
  }
  if (value != (cn_cbor *)0x0) {
    _Var1 = _COSE_map_put((COSE *)h,key,value,flags,perr);
    return _Var1;
  }
  if (perr == (cose_errback *)0x0) {
    return false;
  }
  perr->err = COSE_ERR_INVALID_PARAMETER;
  return false;
}

Assistant:

bool COSE_Sign0_map_put_int(HCOSE_SIGN0 h, int key, cn_cbor * value, int flags, cose_errback * perr)
{
	CHECK_CONDITION(IsValidSign0Handle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(value != NULL, COSE_ERR_INVALID_PARAMETER);

	return _COSE_map_put(&((COSE_Sign0Message *)h)->m_message, key, value, flags, perr);

errorReturn:
	return false;
}